

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O1

uint32_t fill_with_sine(float *buf,uint32_t rate,uint32_t channels,uint32_t frames,
                       uint32_t initial_phase)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  uint32_t uVar4;
  double dVar5;
  
  if (frames != 0) {
    uVar1 = 0;
    uVar2 = 0;
    do {
      if (channels != 0) {
        uVar3 = uVar2;
        uVar4 = channels;
        do {
          dVar5 = sin((double)((float)initial_phase / (float)rate) * 2764.6016120910645);
          uVar2 = (ulong)((int)uVar3 + 1);
          buf[uVar3] = (float)(dVar5 * 0.5);
          uVar4 = uVar4 - 1;
          uVar3 = uVar2;
        } while (uVar4 != 0);
      }
      initial_phase = initial_phase + 1;
      uVar1 = uVar1 + 1;
    } while (uVar1 != frames);
  }
  return initial_phase;
}

Assistant:

uint32_t fill_with_sine(float * buf, uint32_t rate, uint32_t channels,
                        uint32_t frames, uint32_t initial_phase)
{
  uint32_t offset = 0;
  for (uint32_t i = 0; i < frames; i++) {
    float  p = initial_phase++ / static_cast<float>(rate);
    for (uint32_t j = 0; j < channels; j++) {
      buf[offset++] = 0.5 * sin(440. * 2 * PI * p);
    }
  }
  return initial_phase;
}